

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

int ED25519_sign(uint8_t *out_sig,uint8_t *message,size_t message_len,uint8_t *private_key)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  long lVar54;
  uint uVar55;
  ulong uVar56;
  long lVar57;
  uint8_t nonce [64];
  uint8_t hram [64];
  ge_p3 R;
  SHA512_CTX hash_ctx;
  ushort local_268;
  byte local_266;
  undefined2 uStack_265;
  undefined1 uStack_263;
  undefined1 uStack_262;
  undefined1 local_261;
  undefined2 uStack_260;
  undefined1 uStack_25e;
  undefined2 uStack_25d;
  undefined1 local_25b;
  undefined1 uStack_25a;
  undefined1 local_259;
  undefined2 uStack_258;
  undefined1 uStack_256;
  undefined2 uStack_255;
  ushort local_253;
  byte local_251;
  undefined2 uStack_250;
  undefined1 uStack_24e;
  undefined1 uStack_24d;
  undefined1 local_24c;
  undefined2 uStack_24b;
  byte bStack_249;
  undefined1 local_248 [32];
  ushort local_228;
  byte local_226;
  undefined2 uStack_225;
  undefined1 uStack_223;
  undefined1 uStack_222;
  undefined1 local_221;
  undefined2 uStack_220;
  undefined1 uStack_21e;
  undefined2 uStack_21d;
  undefined1 local_21b;
  undefined1 uStack_21a;
  undefined1 local_219;
  undefined2 uStack_218;
  undefined1 uStack_216;
  undefined2 uStack_215;
  ushort local_213;
  byte local_211;
  undefined2 uStack_210;
  undefined1 uStack_20e;
  undefined1 uStack_20d;
  uint local_20c;
  ushort local_1e8;
  byte local_1e6;
  undefined2 uStack_1e5;
  undefined1 uStack_1e3;
  undefined1 uStack_1e2;
  undefined1 local_1e1;
  undefined2 uStack_1e0;
  undefined1 uStack_1de;
  undefined2 uStack_1dd;
  undefined1 local_1db;
  undefined1 uStack_1da;
  undefined1 local_1d9;
  undefined2 uStack_1d8;
  undefined1 uStack_1d6;
  undefined2 uStack_1d5;
  ushort local_1d3;
  byte local_1d1;
  undefined2 uStack_1d0;
  undefined1 uStack_1ce;
  undefined1 uStack_1cd;
  uint local_1cc;
  ge_p3 local_1a8;
  SHA512_CTX local_108;
  
  SHA512(private_key,0x20,(uchar *)&local_268);
  local_268 = local_268 & 0xfff8;
  bStack_249 = bStack_249 & 0x3f | 0x40;
  SHA512_Init(&local_108);
  SHA512_Update(&local_108,local_248,0x20);
  SHA512_Update(&local_108,message,message_len);
  SHA512_Final((uchar *)&local_228,&local_108);
  x25519_sc_reduce((uint8_t *)&local_228);
  x25519_ge_scalarmult_base(&local_1a8,(uint8_t *)&local_228);
  ge_p3_tobytes(out_sig,&local_1a8);
  SHA512_Init(&local_108);
  SHA512_Update(&local_108,out_sig,0x20);
  SHA512_Update(&local_108,private_key + 0x20,0x20);
  SHA512_Update(&local_108,message,message_len);
  SHA512_Final((uchar *)&local_1e8,&local_108);
  x25519_sc_reduce((uint8_t *)&local_1e8);
  uVar14 = (ulong)((local_1e6 & 0x1f) << 0x10) | (ulong)local_1e8;
  uVar15 = (ulong)((local_1d1 & 0x1f) << 0x10) | (ulong)local_1d3;
  uVar24 = (ulong)((local_266 & 0x1f) << 0x10) | (ulong)local_268;
  uVar16 = (ulong)((local_251 & 0x1f) << 0x10) | (ulong)local_253;
  lVar36 = uVar24 * uVar14 + ((ulong)((local_226 & 0x1f) << 0x10) | (ulong)local_228);
  uVar37 = (ulong)(CONCAT13(uStack_1e3,CONCAT21(uStack_1e5,local_1e6)) >> 5 & 0x1fffff);
  uVar49 = (ulong)(CONCAT13(uStack_263,CONCAT21(uStack_265,local_266)) >> 5 & 0x1fffff);
  uVar45 = (ulong)((uint3)(CONCAT12(local_261,CONCAT11(uStack_262,uStack_263)) >> 2) & 0x1fffff);
  uVar46 = (ulong)((uint3)(CONCAT12(local_1e1,CONCAT11(uStack_1e2,uStack_1e3)) >> 2) & 0x1fffff);
  lVar42 = uVar24 * uVar46 + uVar49 * uVar37 +
           uVar45 * uVar14 +
           (ulong)((uint3)(CONCAT12(local_221,CONCAT11(uStack_222,uStack_223)) >> 2) & 0x1fffff);
  uVar30 = (ulong)(CONCAT13(uStack_1de,CONCAT21(uStack_1e0,local_1e1)) >> 7 & 0x1fffff);
  uVar39 = (ulong)(CONCAT13(uStack_25e,CONCAT21(uStack_260,local_261)) >> 7 & 0x1fffff);
  uVar47 = (ulong)(CONCAT13(local_1db,CONCAT21(uStack_1dd,uStack_1de)) >> 4 & 0x1fffff);
  uVar32 = (ulong)(CONCAT13(local_25b,CONCAT21(uStack_25d,uStack_25e)) >> 4 & 0x1fffff);
  lVar43 = uVar24 * uVar47 + uVar49 * uVar30 + uVar39 * uVar37 + uVar14 * uVar32 +
           uVar45 * uVar46 +
           (ulong)(CONCAT13(local_21b,CONCAT21(uStack_21d,uStack_21e)) >> 4 & 0x1fffff);
  uVar13 = (ulong)((uint3)(CONCAT12(local_259,CONCAT11(uStack_25a,local_25b)) >> 1) & 0x1fffff);
  uVar56 = (ulong)((uint3)(CONCAT12(local_1d9,CONCAT11(uStack_1da,local_1db)) >> 1) & 0x1fffff);
  uVar31 = (ulong)(CONCAT13(uStack_256,CONCAT21(uStack_258,local_259)) >> 6 & 0x1fffff);
  uVar44 = (ulong)(CONCAT13(uStack_1d6,CONCAT21(uStack_1d8,local_1d9)) >> 6 & 0x1fffff);
  lVar33 = uVar24 * uVar44 + uVar39 * uVar30 + uVar56 * uVar49 + uVar45 * uVar47 + uVar46 * uVar32 +
           uVar13 * uVar37 + uVar14 * uVar31 +
           (ulong)(CONCAT13(uStack_216,CONCAT21(uStack_218,local_219)) >> 6 & 0x1fffff);
  uVar52 = (ulong)(uint3)(CONCAT21(uStack_255,uStack_256) >> 3);
  uVar21 = (ulong)(uint3)(CONCAT21(uStack_1d5,uStack_1d6) >> 3);
  lVar34 = uVar24 * uVar15 + uVar21 * uVar49 + uVar56 * uVar39 + uVar45 * uVar44 + uVar32 * uVar47 +
           uVar13 * uVar30 + uVar46 * uVar31 + uVar52 * uVar37 +
           uVar16 * uVar14 + (ulong)local_213 + (ulong)((local_211 & 0x1f) << 0x10);
  uVar29 = (ulong)(CONCAT13(uStack_24e,CONCAT21(uStack_250,local_251)) >> 5 & 0x1fffff);
  uVar12 = (ulong)(CONCAT13(uStack_1ce,CONCAT21(uStack_1d0,local_1d1)) >> 5 & 0x1fffff);
  uVar25 = (ulong)((uint3)(CONCAT12(local_24c,CONCAT11(uStack_24d,uStack_24e)) >> 2) & 0x1fffff);
  uVar38 = (ulong)((uint3)(CONCAT12((undefined1)local_1cc,CONCAT11(uStack_1cd,uStack_1ce)) >> 2) &
                  0x1fffff);
  lVar26 = uVar24 * uVar38 + uVar49 * uVar12 + uVar21 * uVar39 + uVar45 * uVar15 + uVar32 * uVar44 +
           uVar13 * uVar56 + uVar31 * uVar47 + uVar52 * uVar30 +
           uVar16 * uVar46 + uVar29 * uVar37 + uVar25 * uVar14 +
           (ulong)((uint3)(CONCAT12((undefined1)local_20c,CONCAT11(uStack_20d,uStack_20e)) >> 2) &
                  0x1fffff);
  uVar20 = (ulong)(CONCAT13(bStack_249,CONCAT21(uStack_24b,local_24c)) >> 7);
  uVar50 = (ulong)(local_1cc >> 7);
  lVar17 = uVar49 * uVar50 + uVar39 * uVar12 + uVar15 * uVar32 + uVar45 * uVar38 +
           uVar13 * uVar21 + uVar31 * uVar44 + uVar52 * uVar56 + uVar29 * uVar30 + uVar16 * uVar47 +
           uVar25 * uVar46 + uVar37 * uVar20;
  lVar40 = uVar39 * uVar50 + uVar15 * uVar31 + uVar38 * uVar32 + uVar13 * uVar12 + uVar52 * uVar21 +
           uVar16 * uVar44 + uVar56 * uVar29 + uVar30 * uVar20 + uVar25 * uVar47;
  lVar18 = uVar13 * uVar50 + uVar38 * uVar31 + uVar52 * uVar12 + uVar21 * uVar29 + uVar16 * uVar15 +
           uVar25 * uVar44 + uVar56 * uVar20;
  lVar35 = uVar52 * uVar50 + uVar29 * uVar12 + uVar16 * uVar38 + uVar25 * uVar15 + uVar21 * uVar20;
  lVar27 = uVar29 * uVar50 + uVar12 * uVar20 + uVar25 * uVar38;
  uVar22 = lVar36 + 0x100000;
  lVar53 = (uVar22 >> 0x15) +
           uVar24 * uVar37 + uVar14 * uVar49 +
           (ulong)(CONCAT13(uStack_223,CONCAT21(uStack_225,local_226)) >> 5 & 0x1fffff);
  uVar1 = lVar42 + 0x100000;
  lVar2 = (uVar1 >> 0x15) +
          uVar24 * uVar30 + uVar14 * uVar39 + uVar46 * uVar49 +
          uVar45 * uVar37 +
          (ulong)(CONCAT13(uStack_21e,CONCAT21(uStack_220,local_221)) >> 7 & 0x1fffff);
  uVar23 = lVar43 + 0x100000;
  lVar19 = (uVar23 >> 0x15) +
           uVar24 * uVar56 + uVar49 * uVar47 + uVar46 * uVar39 + uVar32 * uVar37 +
           uVar45 * uVar30 + uVar13 * uVar14 +
           (ulong)((uint3)(CONCAT12(local_219,CONCAT11(uStack_21a,local_21b)) >> 1) & 0x1fffff);
  uVar3 = lVar33 + 0x100000;
  lVar4 = (uVar3 >> 0x15) +
          uVar24 * uVar21 + uVar49 * uVar44 + uVar39 * uVar47 + uVar32 * uVar30 +
          uVar45 * uVar56 + uVar31 * uVar37 +
          uVar13 * uVar46 + uVar52 * uVar14 + (ulong)(uint3)(CONCAT21(uStack_215,uStack_216) >> 3);
  uVar5 = lVar34 + 0x100000;
  lVar6 = (uVar5 >> 0x15) +
          uVar24 * uVar12 + uVar15 * uVar49 + uVar39 * uVar44 + uVar45 * uVar21 + uVar56 * uVar32 +
          uVar13 * uVar47 + uVar31 * uVar30 + uVar52 * uVar46 +
          uVar16 * uVar37 + uVar14 * uVar29 +
          (ulong)(CONCAT13(uStack_20e,CONCAT21(uStack_210,local_211)) >> 5 & 0x1fffff);
  uVar7 = lVar26 + 0x100000;
  lVar8 = (uVar7 >> 0x15) +
          uVar24 * uVar50 + uVar15 * uVar39 + uVar38 * uVar49 + uVar45 * uVar12 + uVar21 * uVar32 +
          uVar13 * uVar44 + uVar56 * uVar31 + uVar52 * uVar47 +
          uVar16 * uVar30 + uVar46 * uVar29 + uVar14 * uVar20 + uVar25 * uVar37 +
          (ulong)(local_20c >> 7);
  uVar24 = lVar17 + 0x100000;
  lVar9 = (uVar24 >> 0x15) +
          uVar45 * uVar50 + uVar21 * uVar31 + uVar38 * uVar39 + uVar32 * uVar12 +
          uVar13 * uVar15 + uVar52 * uVar44 + uVar29 * uVar47 +
          uVar16 * uVar56 + uVar46 * uVar20 + uVar25 * uVar30;
  uVar14 = lVar40 + 0x100000;
  lVar10 = (uVar14 >> 0x15) +
           uVar32 * uVar50 + uVar31 * uVar12 + uVar52 * uVar15 + uVar13 * uVar38 +
           uVar16 * uVar21 + uVar29 * uVar44 + uVar47 * uVar20 + uVar25 * uVar56;
  uVar13 = lVar18 + 0x100000;
  lVar28 = (uVar13 >> 0x15) +
           uVar31 * uVar50 + uVar15 * uVar29 + uVar52 * uVar38 +
           uVar16 * uVar12 + uVar44 * uVar20 + uVar25 * uVar21;
  uVar52 = lVar35 + 0x100000;
  lVar41 = (uVar52 >> 0x15) + uVar16 * uVar50 + uVar15 * uVar20 + uVar38 * uVar29 + uVar25 * uVar12;
  uVar21 = lVar27 + 0x100000;
  lVar11 = (uVar21 >> 0x15) + uVar25 * uVar50 + uVar38 * uVar20;
  uVar31 = uVar20 * uVar50 + 0x100000;
  uVar29 = lVar53 + 0x100000;
  uVar15 = lVar2 + 0x100000;
  uVar16 = lVar28 + 0x100000;
  lVar48 = (uVar16 >> 0x15) + (lVar35 - (uVar52 & 0xffffffffffe00000));
  uVar52 = lVar41 + 0x100000;
  lVar54 = (uVar52 >> 0x15) + (lVar27 - (uVar21 & 0xffffffffffe00000));
  lVar41 = lVar41 - (uVar52 & 0xffffffffffe00000);
  uVar52 = lVar11 + 0x100000;
  lVar27 = (uVar52 >> 0x15) + (uVar20 * uVar50 - (uVar31 & 0xffffffffffe00000));
  lVar11 = lVar11 - (uVar52 & 0xffffffffffe00000);
  uVar31 = uVar31 >> 0x15;
  uVar20 = lVar10 + 0x100000;
  lVar18 = ((uVar31 * -0xa6f7d + lVar18) - (uVar13 & 0xffffffffffe00000)) + (uVar20 >> 0x15);
  uVar12 = lVar9 + 0x100000;
  lVar35 = ((uVar31 * -0xf39ad + lVar40) - (uVar14 & 0xffffffffffe00000)) + (uVar12 >> 0x15) +
           lVar27 * 0x215d1 + lVar11 * -0xa6f7d;
  uVar21 = lVar8 + 0x100000;
  lVar17 = ((uVar31 * 0x72d18 + lVar17) - (uVar24 & 0xffffffffffe00000)) + lVar27 * 0x9fb67 +
           lVar11 * -0xf39ad + lVar41 * -0xa6f7d + lVar54 * 0x215d1 + (uVar21 >> 0x15);
  uVar24 = lVar19 + 0x100000;
  lVar57 = ((lVar48 * 0xa2c13 + lVar33) - (uVar3 & 0xffffffffffe00000)) + (uVar24 >> 0x15);
  uVar14 = lVar4 + 0x100000;
  lVar51 = ((uVar14 >> 0x15) + lVar34 + lVar48 * 0x9fb67 + lVar41 * 0x72d18 + lVar54 * 0xa2c13) -
           (uVar5 & 0xffffffffffe00000);
  uVar13 = lVar6 + 0x100000;
  lVar26 = (lVar48 * 0x215d1 + (uVar13 >> 0x15) +
            lVar41 * -0xf39ad + lVar54 * 0x9fb67 + lVar11 * 0x72d18 + lVar27 * 0xa2c13 + lVar26) -
           (uVar7 & 0xffffffffffe00000);
  uVar52 = lVar57 + 0x100000;
  lVar33 = ((lVar41 * 0xa2c13 + lVar4 + lVar48 * 0x72d18) - (uVar14 & 0xffffffffffe00000)) +
           ((long)uVar52 >> 0x15);
  uVar14 = lVar51 + 0x100000;
  lVar34 = ((lVar48 * -0xf39ad + lVar6 + lVar41 * 0x9fb67 + lVar54 * 0x72d18 + lVar11 * 0xa2c13) -
           (uVar13 & 0xffffffffffe00000)) + ((long)uVar14 >> 0x15);
  uVar13 = lVar26 + 0x100000;
  lVar40 = ((lVar48 * -0xa6f7d + lVar8 +
            lVar41 * 0x215d1 + lVar54 * -0xf39ad +
            lVar11 * 0x9fb67 + lVar27 * 0x72d18 + uVar31 * 0xa2c13) - (uVar21 & 0xffffffffffe00000))
           + ((long)uVar13 >> 0x15);
  uVar21 = lVar17 + 0x100000;
  lVar8 = ((uVar31 * 0x9fb67 + lVar9) - (uVar12 & 0xffffffffffe00000)) + lVar27 * -0xf39ad +
          lVar11 * 0x215d1 + lVar54 * -0xa6f7d + ((long)uVar21 >> 0x15);
  uVar3 = lVar35 + 0x100000;
  lVar41 = ((uVar31 * 0x215d1 + lVar10) - (uVar20 & 0xffffffffffe00000)) + lVar27 * -0xa6f7d +
           ((long)uVar3 >> 0x15);
  uVar31 = lVar18 + 0x100000;
  lVar27 = ((long)uVar31 >> 0x15) + (lVar28 - (uVar16 & 0xffffffffffe00000));
  uVar16 = lVar40 + 0x100000;
  lVar28 = ((long)uVar16 >> 0x15) + (lVar17 - (uVar21 & 0xffffffffffe00000));
  uVar21 = lVar8 + 0x100000;
  lVar35 = ((long)uVar21 >> 0x15) + (lVar35 - (uVar3 & 0xffffffffffe00000));
  lVar8 = lVar8 - (uVar21 & 0xffffffffffe00000);
  uVar21 = lVar41 + 0x100000;
  lVar18 = ((long)uVar21 >> 0x15) + (lVar18 - (uVar31 & 0xffffffffffe00000));
  lVar41 = lVar41 - (uVar21 & 0xffffffffffe00000);
  uVar21 = lVar34 + 0x100000;
  lVar9 = (lVar27 * -0xa6f7d + lVar26 + ((long)uVar21 >> 0x15)) - (uVar13 & 0xffffffffffe00000);
  uVar13 = lVar33 + 0x100000;
  lVar26 = (lVar27 * -0xf39ad + lVar51 + lVar18 * 0x215d1 +
           lVar41 * -0xa6f7d + ((long)uVar13 >> 0x15)) - (uVar14 & 0xffffffffffe00000);
  lVar10 = ((lVar27 * 0x72d18 + lVar57) - (uVar52 & 0xffffffffffe00000)) + lVar18 * 0x9fb67 +
           lVar41 * -0xf39ad + lVar35 * 0x215d1 + lVar8 * -0xa6f7d;
  lVar4 = lVar28 * 0xa2c13 + (lVar36 - (uVar22 & 0xffffffffffe00000));
  lVar17 = (((uVar29 >> 0x15) + lVar42) - (uVar1 & 0xffffffffffe00000)) + lVar35 * 0xa2c13 +
           lVar8 * 0x72d18 + lVar28 * 0x9fb67;
  lVar6 = lVar28 * 0x215d1 +
          lVar8 * -0xf39ad +
          lVar35 * 0x9fb67 +
          lVar41 * 0x72d18 +
          lVar18 * 0xa2c13 + (uVar15 >> 0x15) + (lVar43 - (uVar23 & 0xffffffffffe00000));
  uVar3 = lVar4 + 0x100000;
  lVar11 = ((long)uVar3 >> 0x15) +
           lVar28 * 0x72d18 + lVar8 * 0xa2c13 + (lVar53 - (uVar29 & 0xffffffffffe00000));
  uVar22 = lVar17 + 0x100000;
  lVar2 = ((long)uVar22 >> 0x15) +
          lVar28 * -0xf39ad +
          lVar8 * 0x9fb67 +
          lVar35 * 0x72d18 + lVar41 * 0xa2c13 + (lVar2 - (uVar15 & 0xffffffffffe00000));
  uVar23 = lVar6 + 0x100000;
  lVar8 = ((lVar27 * 0xa2c13 + lVar19) - (uVar24 & 0xffffffffffe00000)) + lVar18 * 0x72d18 +
          lVar41 * 0x9fb67 + lVar35 * -0xf39ad + lVar8 * 0x215d1 + lVar28 * -0xa6f7d +
          ((long)uVar23 >> 0x15);
  uVar14 = lVar10 + 0x100000;
  lVar28 = ((lVar27 * 0x9fb67 + lVar33 + lVar18 * -0xf39ad + lVar41 * 0x215d1) -
           (uVar13 & 0xffffffffffe00000)) + lVar35 * -0xa6f7d + ((long)uVar14 >> 0x15);
  uVar13 = lVar26 + 0x100000;
  lVar18 = ((lVar27 * 0x215d1 + lVar34 + lVar18 * -0xa6f7d) - (uVar21 & 0xffffffffffe00000)) +
           ((long)uVar13 >> 0x15);
  uVar1 = lVar9 + 0x100000;
  lVar27 = ((long)uVar1 >> 0x15) + (lVar40 - (uVar16 & 0xffffffffffe00000));
  uVar52 = lVar8 + 0x100000;
  uVar21 = lVar28 + 0x100000;
  uVar31 = lVar18 + 0x100000;
  uVar29 = lVar11 + 0x100000;
  uVar15 = lVar2 + 0x100000;
  uVar7 = lVar27 + 0x100000;
  lVar19 = (long)uVar7 >> 0x15;
  uVar16 = lVar19 * 0xa2c13 + (lVar4 - (uVar3 & 0xffffffffffe00000));
  uVar3 = ((lVar19 * 0x72d18 + lVar11) - (uVar29 & 0xffffffffffe00000)) + ((long)uVar16 >> 0x15);
  uVar5 = ((lVar19 * 0x9fb67 + lVar17) - (uVar22 & 0xffffffffffe00000)) + ((long)uVar29 >> 0x15) +
          ((long)uVar3 >> 0x15);
  uVar24 = ((lVar19 * -0xf39ad + lVar2) - (uVar15 & 0xffffffffffe00000)) + ((long)uVar5 >> 0x15);
  uVar29 = ((lVar19 * 0x215d1 + lVar6) - (uVar23 & 0xffffffffffe00000)) + ((long)uVar15 >> 0x15) +
           ((long)uVar24 >> 0x15);
  uVar15 = ((lVar19 * -0xa6f7d + lVar8) - (uVar52 & 0xffffffffffe00000)) + ((long)uVar29 >> 0x15);
  uVar14 = ((long)uVar15 >> 0x15) +
           ((long)uVar52 >> 0x15) + (lVar10 - (uVar14 & 0xffffffffffe00000));
  uVar52 = ((long)uVar14 >> 0x15) + (lVar28 - (uVar21 & 0xffffffffffe00000));
  uVar12 = ((long)uVar52 >> 0x15) +
           ((long)uVar21 >> 0x15) + (lVar26 - (uVar13 & 0xffffffffffe00000));
  uVar20 = ((long)uVar12 >> 0x15) + (lVar18 - (uVar31 & 0xffffffffffe00000));
  uVar22 = (lVar9 - (uVar1 & 0xffffffffffe00000)) + ((long)uVar31 >> 0x15) + ((long)uVar20 >> 0x15);
  lVar6 = ((long)uVar22 >> 0x15) + (lVar27 - (uVar7 & 0xffffffffffe00000));
  lVar4 = lVar6 >> 0x15;
  lVar2 = lVar4 * 0xa2c13 + (uVar16 & 0x1fffff);
  uVar23 = (lVar2 >> 0x15) + lVar4 * 0x72d18 + (uVar3 & 0x1fffff);
  uVar13 = ((long)uVar23 >> 0x15) + lVar4 * 0x9fb67 + (uVar5 & 0x1fffff);
  uVar16 = ((long)uVar13 >> 0x15) + lVar4 * -0xf39ad + (uVar24 & 0x1fffff);
  uVar29 = ((long)uVar16 >> 0x15) + lVar4 * 0x215d1 + (uVar29 & 0x1fffff);
  uVar31 = ((long)uVar29 >> 0x15) + lVar4 * -0xa6f7d + (uVar15 & 0x1fffff);
  uVar21 = ((long)uVar31 >> 0x15) + (uVar14 & 0x1fffff);
  uVar52 = ((long)uVar21 >> 0x15) + (uVar52 & 0x1fffff);
  lVar4 = ((long)uVar52 >> 0x15) + (uVar12 & 0x1fffff);
  uVar14 = (lVar4 >> 0x15) + (uVar20 & 0x1fffff);
  uVar22 = ((long)uVar14 >> 0x15) + (uVar22 & 0x1fffff);
  uVar55 = (int)(uVar22 >> 0x15) + ((uint)lVar6 & 0x1fffff);
  out_sig[0x20] = (uint8_t)lVar2;
  out_sig[0x21] = (uint8_t)((ulong)lVar2 >> 8);
  out_sig[0x22] = (byte)((uint)uVar23 << 5) | (byte)((ulong)lVar2 >> 0x10) & 0x1f;
  out_sig[0x23] = (uint8_t)(uVar23 >> 3);
  out_sig[0x24] = (uint8_t)(uVar23 >> 0xb);
  out_sig[0x25] = ((byte)((uint)uVar23 >> 0x13) & 3) + (char)uVar13 * '\x04';
  out_sig[0x26] = (uint8_t)(uVar13 >> 6);
  out_sig[0x27] = (byte)((uint)uVar16 << 7) | (byte)((uint)uVar13 >> 0xe) & 0x7f;
  out_sig[0x28] = (uint8_t)(uVar16 >> 1);
  out_sig[0x29] = (uint8_t)(uVar16 >> 9);
  out_sig[0x2a] = (byte)((uint)uVar29 << 4) | (byte)((uint)uVar16 >> 0x11) & 0xf;
  out_sig[0x2b] = (uint8_t)(uVar29 >> 4);
  out_sig[0x2c] = (uint8_t)(uVar29 >> 0xc);
  out_sig[0x2d] = ((byte)((uint)uVar29 >> 0x14) & 1) + (char)uVar31 * '\x02';
  out_sig[0x2e] = (uint8_t)(uVar31 >> 7);
  out_sig[0x2f] = (byte)((uint)uVar21 << 6) | (byte)((uint)uVar31 >> 0xf) & 0x3f;
  out_sig[0x30] = (uint8_t)(uVar21 >> 2);
  out_sig[0x31] = (uint8_t)(uVar21 >> 10);
  out_sig[0x32] = ((byte)((uint)uVar21 >> 0x12) & 7) + (char)uVar52 * '\b';
  out_sig[0x33] = (uint8_t)(uVar52 >> 5);
  out_sig[0x34] = (uint8_t)((uint)uVar52 >> 0xd);
  out_sig[0x35] = (uint8_t)lVar4;
  out_sig[0x36] = (uint8_t)((ulong)lVar4 >> 8);
  out_sig[0x37] = (byte)((uint)uVar14 << 5) | (byte)((ulong)lVar4 >> 0x10) & 0x1f;
  out_sig[0x38] = (uint8_t)(uVar14 >> 3);
  out_sig[0x39] = (uint8_t)(uVar14 >> 0xb);
  out_sig[0x3a] = ((byte)((uint)uVar14 >> 0x13) & 3) + (char)uVar22 * '\x04';
  out_sig[0x3b] = (uint8_t)(uVar22 >> 6);
  out_sig[0x3c] = (char)uVar55 * -0x80 | (byte)((uint)uVar22 >> 0xe) & 0x7f;
  out_sig[0x3d] = (uint8_t)(uVar55 >> 1);
  out_sig[0x3e] = (uint8_t)(uVar55 >> 9);
  out_sig[0x3f] = (uint8_t)(uVar55 >> 0x11);
  return 1;
}

Assistant:

int ED25519_sign(uint8_t out_sig[64], const uint8_t *message,
                 size_t message_len, const uint8_t private_key[64]) {
  // NOTE: The documentation on this function says that it returns zero on
  // allocation failure. While that can't happen with the current
  // implementation, we want to reserve the ability to allocate in this
  // implementation in the future.

  uint8_t az[SHA512_DIGEST_LENGTH];
  SHA512(private_key, 32, az);

  az[0] &= 248;
  az[31] &= 63;
  az[31] |= 64;

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, az + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t nonce[SHA512_DIGEST_LENGTH];
  SHA512_Final(nonce, &hash_ctx);

  x25519_sc_reduce(nonce);
  ge_p3 R;
  x25519_ge_scalarmult_base(&R, nonce);
  ge_p3_tobytes(out_sig, &R);

  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, out_sig, 32);
  SHA512_Update(&hash_ctx, private_key + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t hram[SHA512_DIGEST_LENGTH];
  SHA512_Final(hram, &hash_ctx);

  x25519_sc_reduce(hram);
  sc_muladd(out_sig + 32, hram, az, nonce);

  // The signature is computed from the private key, but is public.
  CONSTTIME_DECLASSIFY(out_sig, 64);
  return 1;
}